

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

_Bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event,ALLEGRO_TIMEOUT *timeout
                       )

{
  _AL_MUTEX *m;
  int iVar1;
  ALLEGRO_EVENT *pAVar2;
  long lVar3;
  int result;
  byte bVar4;
  
  bVar4 = 0;
  m = &queue->mutex;
  _al_mutex_lock(m);
  iVar1 = 0;
  while ((queue->events_head == queue->events_tail && (iVar1 != -1))) {
    iVar1 = _al_cond_timedwait(&queue->cond,m,timeout);
  }
  if (ret_event != (ALLEGRO_EVENT *)0x0 && iVar1 != -1) {
    pAVar2 = get_next_event_if_any(queue,true);
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)ret_event = *(undefined8 *)pAVar2;
      pAVar2 = (ALLEGRO_EVENT *)((long)pAVar2 + (ulong)bVar4 * -0x10 + 8);
      ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar4 * -0x10 + 8);
    }
  }
  _al_mutex_unlock(m);
  return iVar1 != -1;
}

Assistant:

static bool do_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT *ret_event, ALLEGRO_TIMEOUT *timeout)
{
   bool timed_out = false;
   ALLEGRO_EVENT *next_event = NULL;

   _al_mutex_lock(&queue->mutex);
   {
      int result = 0;

      /* Is the queue is non-empty?  If not, block on a condition
       * variable, which will be signaled when an event is placed into
       * the queue.
       */
      while (is_event_queue_empty(queue) && (result != -1)) {
         result = _al_cond_timedwait(&queue->cond, &queue->mutex, timeout);
      }

      if (result == -1)
         timed_out = true;
      else if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);

   if (timed_out)
      return false;

   return true;
}